

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O3

void __thiscall xmrig::Base::Base(Base *this,Process *process)

{
  BasePrivate *this_00;
  Config *pCVar1;
  
  (this->super_IWatcherListener)._vptr_IWatcherListener = (_func_int **)&PTR__Base_001aba28;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Base_001aba78;
  this_00 = (BasePrivate *)operator_new(0x30);
  this_00->api = (Api *)0x0;
  pCVar1 = BasePrivate::load(this_00,process);
  this_00->config = pCVar1;
  (this_00->listeners).
  super__Vector_base<xmrig::IBaseListener_*,_std::allocator<xmrig::IBaseListener_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->listeners).
  super__Vector_base<xmrig::IBaseListener_*,_std::allocator<xmrig::IBaseListener_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->listeners).
  super__Vector_base<xmrig::IBaseListener_*,_std::allocator<xmrig::IBaseListener_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->watcher = (Watcher *)0x0;
  this->d_ptr = this_00;
  return;
}

Assistant:

xmrig::Base::Base(Process *process)
    : d_ptr(new BasePrivate(process))
{
}